

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

bool __thiscall QMakeSourceFileInfo::mocable(QMakeSourceFileInfo *this,QString *file)

{
  SourceFiles *this_00;
  bool bVar1;
  SourceFile *pSVar2;
  long in_FS_OFFSET;
  QMakeLocalFileName QStack_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->files;
  QMakeLocalFileName::QMakeLocalFileName(&QStack_48,file);
  pSVar2 = SourceFiles::lookupFile(this_00,&QStack_48);
  QMakeLocalFileName::~QMakeLocalFileName(&QStack_48);
  if (pSVar2 == (SourceFile *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = (bool)(pSVar2->field_0x3c & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeSourceFileInfo::mocable(const QString &file)
{
    if(SourceFile *node = files->lookupFile(QMakeLocalFileName(file)))
        return node->mocable;
    return false;
}